

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_yield(lua_State *L,int nresults)

{
  int nresults_local;
  lua_State *L_local;
  
  if (L->baseCcalls < L->nCcalls) {
    luaG_runerror(L,"attempt to yield across metamethod/C-call boundary");
  }
  L->base = L->top + -(long)nresults;
  L->status = '\x01';
  return -1;
}

Assistant:

LUA_API int lua_yield (lua_State *L, int nresults) {
  luai_userstateyield(L, nresults);
  lua_lock(L);
  if (L->nCcalls > L->baseCcalls)
    luaG_runerror(L, "attempt to yield across metamethod/C-call boundary");
  L->base = L->top - nresults;  /* protect stack slots below */
  L->status = LUA_YIELD;
  lua_unlock(L);
  return -1;
}